

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_server.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  sz_pid_t sVar1;
  self *psVar2;
  LogStream *this;
  SourceFile file;
  undefined1 local_10f8 [8];
  Channel channel;
  undefined1 local_128 [8];
  EventLoop loop;
  undefined4 local_70;
  function<void_(sznet::Timestamp)> local_68;
  _Bind<void_(*(int,_std::_Placeholder<1>))(int,_sznet::Timestamp)> local_48;
  undefined1 local_34 [8];
  InetAddress bindAddr;
  Socket sock;
  
  sznet::sztool_memcheck();
  signal(2,StopSignal);
  signal(0xf,StopSignal);
  if (sznet::g_logLevel < 3) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)
               &loop.m_pendingFunctors.
                super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)loop.m_pendingFunctors.
                          super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    file.m_size = local_70;
    sznet::Logger::Logger((Logger *)local_10f8,file,0x4a);
    psVar2 = sznet::LogStream::operator<<((LogStream *)&channel,"pid = ");
    sVar1 = sznet::sz_getpid();
    this = sznet::LogStream::operator<<(psVar2,sVar1);
    psVar2 = sznet::LogStream::operator<<(this,", tid = ");
    sVar1 = sznet::CurrentThread::tid();
    sznet::LogStream::operator<<(psVar2,sVar1);
    sznet::Logger::~Logger((Logger *)local_10f8);
  }
  sznet::net::EventLoop::EventLoop((EventLoop *)local_128);
  g_pLoopsRun = (EventLoop *)local_128;
  sznet::net::InetAddress::InetAddress((InetAddress *)local_34,0x7e7,false,false);
  bindAddr.field_0._20_4_ = sznet::net::sockets::sz_udp_create((uint)(ushort)local_34._0_2_);
  bindAddr.field_0.m_addr6.sin6_scope_id._0_1_ = 1;
  sznet::net::sockets::sz_sock_setnonblock(bindAddr.field_0._20_4_,true);
  sznet::net::Socket::bindAddress
            ((Socket *)((long)&bindAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc),
             (InetAddress *)local_34);
  sznet::net::Channel::Channel((Channel *)local_10f8,(EventLoop *)local_128,bindAddr.field_0._20_4_)
  ;
  local_48._M_f = UdpServerReadCallback;
  local_48._M_bound_args.super__Tuple_impl<0UL,_int,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_int,_false>._M_head_impl =
       (_Tuple_impl<0UL,_int,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_int,_std::_Placeholder<1>_>)bindAddr.field_0._20_4_;
  std::function<void(sznet::Timestamp)>::
  function<std::_Bind<void(*(int,std::_Placeholder<1>))(int,sznet::Timestamp)>,void>
            ((function<void(sznet::Timestamp)> *)&local_68,&local_48);
  std::function<void_(sznet::Timestamp)>::operator=
            ((function<void_(sznet::Timestamp)> *)&channel.m_tied,&local_68);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  sznet::net::Channel::enableReading((Channel *)local_10f8);
  sznet::net::EventLoop::loop((EventLoop *)local_128);
  sznet::net::Channel::~Channel((Channel *)local_10f8);
  sznet::net::Socket::~Socket((Socket *)((long)&bindAddr.field_0.m_addr6.sin6_addr.__in6_u + 0xc));
  sznet::net::EventLoop::~EventLoop((EventLoop *)local_128);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    sznet::sztool_memcheck();
#ifdef _WIN32
    static int block = 0;
    if (block)
    {
        _CrtSetBreakAlloc(block);
    }
#endif

    signal(SIGINT, StopSignal);
    signal(SIGTERM, StopSignal);

    LOG_INFO << "pid = " << sz_getpid() << ", tid = " << CurrentThread::tid();

    EventLoop loop;
    g_pLoopsRun = &loop;
    InetAddress bindAddr(2023);
    Socket sock(sockets::sz_udp_create(bindAddr.family()));
    sockets::sz_sock_setnonblock(sock.fd(), true);
    sock.bindAddress(bindAddr);
    Channel channel(&loop, sock.fd());
    channel.setReadCallback(std::bind(&UdpServerReadCallback, sock.fd(), std::placeholders::_1));
    channel.enableReading();

    loop.loop();

    return 0;
}